

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_runner.h
# Opt level: O1

void __thiscall TestRunner::RunTest<void(*)()>(TestRunner *this,_func_void *func,string *test_name)

{
  ostream *poVar1;
  
  (*func)();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(test_name->_M_dataplus)._M_p,
                      test_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," OK",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void RunTest(TestFunc func, const string& test_name) {
        try {
            func();
            cerr << test_name << " OK" << endl;
        } catch (runtime_error& e) {
            ++fail_count;
            cerr << test_name << " fail: " << e.what() << endl;
        }
    }